

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

size_t __thiscall
google::protobuf::(anonymous_namespace)::SymbolByParentHash::operator()
          (SymbolByParentHash *this,Symbol *s)

{
  uintptr_t v;
  uint64_t uVar1;
  ulong uVar2;
  uint64_t v_3;
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> local_30;
  
  Symbol::parent_name_key(&local_30,(Symbol *)this);
  uVar2 = ((ulong)local_30.first ^ 0x1917468) * -0x234dd359734ecb13;
  uVar2 = ((uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
            (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
            (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) ^ (ulong)local_30.first) * -0x234dd359734ecb13
  ;
  uVar1 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                    (uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                     (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                     (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                     (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38,local_30.second._M_str,
                     local_30.second._M_len);
  uVar2 = (uVar1 ^ local_30.second._M_len) * -0x234dd359734ecb13;
  return uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
         (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
         (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
}

Assistant:

size_t operator()(const T& s) const {
    return absl::HashOf(s.parent_name_key());
  }